

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_utils.h
# Opt level: O0

int VP8RandomBits2(VP8Random *rg,int num_bits,int amp)

{
  int iVar1;
  int diff;
  int amp_local;
  int num_bits_local;
  VP8Random *rg_local;
  
  diff = rg->tab_[rg->index1_] - rg->tab_[rg->index2_];
  if (diff < 0) {
    diff = diff + -0x80000000;
  }
  rg->tab_[rg->index1_] = diff;
  iVar1 = rg->index1_ + 1;
  rg->index1_ = iVar1;
  if (iVar1 == 0x37) {
    rg->index1_ = 0;
  }
  iVar1 = rg->index2_ + 1;
  rg->index2_ = iVar1;
  if (iVar1 == 0x37) {
    rg->index2_ = 0;
  }
  return (1 << ((char)num_bits - 1U & 0x1f)) +
         (((diff << 1) >> (0x20U - (char)num_bits & 0x1f)) * amp >> 8);
}

Assistant:

static WEBP_INLINE int VP8RandomBits2(VP8Random* const rg, int num_bits,
                                      int amp) {
  int diff;
  assert(num_bits + VP8_RANDOM_DITHER_FIX <= 31);
  diff = rg->tab_[rg->index1_] - rg->tab_[rg->index2_];
  if (diff < 0) diff += (1u << 31);
  rg->tab_[rg->index1_] = diff;
  if (++rg->index1_ == VP8_RANDOM_TABLE_SIZE) rg->index1_ = 0;
  if (++rg->index2_ == VP8_RANDOM_TABLE_SIZE) rg->index2_ = 0;
  // sign-extend, 0-center
  diff = (int)((uint32_t)diff << 1) >> (32 - num_bits);
  diff = (diff * amp) >> VP8_RANDOM_DITHER_FIX;  // restrict range
  diff += 1 << (num_bits - 1);                   // shift back to 0.5-center
  return diff;
}